

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O0

int varinfo_set_variant(varinfo *info,char *variant)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int i;
  int varset;
  int data;
  char *variant_local;
  varinfo *info_local;
  
  _varset = variant;
  variant_local = (char *)info;
  iVar1 = symtab_get_t(info->data->symtab,variant,1,&i);
  if (iVar1 == -1) {
    fprintf(_stderr,"no variant %s\n",_varset);
    info_local._4_4_ = -1;
  }
  else {
    iVar1 = *(int *)(*(long *)(*(long *)variant_local + 0x18) + (long)i * 0x30 + 0x28);
    if ((*(int *)(*(long *)(variant_local + 0x10) + (long)iVar1 * 4) == -1) ||
       (*(int *)(*(long *)(variant_local + 0x10) + (long)iVar1 * 4) == i)) {
      for (local_2c = 0; local_2c < *(int *)(*(long *)variant_local + 0x10); local_2c = local_2c + 1
          ) {
        iVar2 = mask_get(*(uint32_t **)(variant_local + 8),local_2c);
        if ((iVar2 != 0) &&
           (iVar2 = mask_intersect(*(uint32_t **)
                                    (*(long *)(*(long *)variant_local + 8) + (long)local_2c * 0x40 +
                                    0x18),*(uint32_t **)
                                           (*(long *)(*(long *)variant_local + 0x18) +
                                            (long)i * 0x30 + 0x10),
                                   *(int *)(*(long *)variant_local + 0x10)), iVar2 != -1)) {
          fprintf(_stderr,"variant %s conflicts with feature %s\n",
                  *(undefined8 *)(*(long *)(*(long *)variant_local + 0x18) + (long)i * 0x30),
                  *(undefined8 *)(*(long *)(*(long *)variant_local + 8) + (long)local_2c * 0x40));
          return -1;
        }
      }
      *(int *)(*(long *)(variant_local + 0x10) + (long)iVar1 * 4) = i;
      mask_or(*(uint32_t **)(variant_local + 8),
              *(uint32_t **)(*(long *)(*(long *)variant_local + 0x18) + (long)i * 0x30 + 0x10),
              *(int *)(*(long *)variant_local + 0x10));
      info_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"a variant from varset %s has already been selected\n",
              *(undefined8 *)(*(long *)(*(long *)variant_local + 0x28) + (long)iVar1 * 0x10));
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

int varinfo_set_variant(struct varinfo *info, const char *variant) {
	int data;
	if (symtab_get_t(info->data->symtab, variant, VARDATA_ST_VARIANT, &data) == -1) {
		fprintf(stderr, "no variant %s\n", variant);
		return -1;
	}
	int varset = info->data->variants[data].varset;
	if (info->variants[varset] != -1 && info->variants[varset] != data) {
		fprintf(stderr, "a variant from varset %s has already been selected\n", info->data->varsets[varset].name);
		return -1;
	}
	int i;
	for (i = 0; i < info->data->featuresnum; i++) {
		if (mask_get(info->fmask, i) && mask_intersect(info->data->features[i].cfmask, info->data->variants[data].fmask, info->data->featuresnum) != -1) {
			fprintf(stderr, "variant %s conflicts with feature %s\n", info->data->variants[data].name, info->data->features[i].name);
			return -1;
		}
	}
	info->variants[varset] = data;
	mask_or(info->fmask, info->data->variants[data].fmask, info->data->featuresnum);
	return 0;
}